

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_50934::BadVulkanAllocExceptionTest_NoHostMemory_Test::TestBody
          (BadVulkanAllocExceptionTest_NoHostMemory_Test *this)

{
  bad_vulkan_alloc *this_00;
  pointer *__ptr;
  AssertionResult gtest_ar;
  
  this_00 = (bad_vulkan_alloc *)__cxa_allocate_exception(0x1b0);
  bad_vulkan_alloc::bad_vulkan_alloc(this_00,-1,"no host memory test");
  __cxa_throw(this_00,&bad_vulkan_alloc::typeinfo,bad_vulkan_alloc::~bad_vulkan_alloc);
}

Assistant:

TEST(BadVulkanAllocExceptionTest, NoHostMemory) {
    try {
        throw bad_vulkan_alloc(OUT_OF_HOST_MEMORY, "no host memory test");
    } catch (bad_vulkan_alloc& e) {
        EXPECT_EQ(strcmp(e.what(), "Out of host memory for no host memory test."), 0);
    }
}